

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O2

float * Eigen::internal::conditional_aligned_new_auto<float,true>(size_t size)

{
  float *pfVar1;
  
  if (size != 0) {
    if (size >> 0x3e != 0) {
      throw_std_bad_alloc();
    }
    pfVar1 = (float *)aligned_malloc(size << 2);
    return pfVar1;
  }
  return (float *)0x0;
}

Assistant:

inline T* conditional_aligned_new_auto(size_t size)
{
  if(size==0)
    return 0; // short-cut. Also fixes Bug 884
  check_size_for_overflow<T>(size);
  T *result = reinterpret_cast<T*>(conditional_aligned_malloc<Align>(sizeof(T)*size));
  if(NumTraits<T>::RequireInitialization)
    construct_elements_of_array(result, size);
  return result;
}